

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O2

int anon_unknown.dwarf_3d90f::xFullPathname(sqlite3_vfs *param_1,char *zName,int nOut,char *zOut)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 1;
  if (zName != (char *)0x0) {
    for (lVar2 = 0; (lVar2 < nOut && (zName[lVar2] != '\0')); lVar2 = lVar2 + 1) {
      zOut[lVar2] = zName[lVar2];
    }
    if (lVar2 < nOut) {
      zOut[lVar2] = '\0';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int xFullPathname(sqlite3_vfs *, const char *zName, int nOut, char *zOut)
{
    if (!zName)
        return SQLITE_ERROR;

    int i = 0;
    for (;zName[i] && i < nOut; ++i)
        zOut[i] = zName[i];

    if (i >= nOut)
        return SQLITE_ERROR;

    zOut[i] = '\0';
    return SQLITE_OK;
}